

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

int __thiscall ON_PolyCurve::CloseGaps(ON_PolyCurve *this)

{
  bool bVar1;
  uint gap_index;
  int ends_to_modify;
  int iVar2;
  uint segment_index0;
  
  iVar2 = 0;
  segment_index0 = 0;
  while( true ) {
    gap_index = FindNextGap(this,segment_index0);
    if ((gap_index <= segment_index0) ||
       ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)gap_index)) break;
    bVar1 = CloseGap(this,gap_index,ends_to_modify);
    iVar2 = iVar2 + (uint)bVar1;
    segment_index0 = gap_index;
  }
  return iVar2;
}

Assistant:

int ON_PolyCurve::CloseGaps()
{
  int rc = 0;
  int segment_index0 = 0;
  int gap_index = 0;
  
  for(;;)
  {
    gap_index = FindNextGap(segment_index0);
    if ( gap_index <= segment_index0 || gap_index >= m_segment.Count() )
      break;
    if ( CloseGap(gap_index,0) )
      rc++;
    segment_index0 = gap_index;
  }

  return rc;
}